

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

void __thiscall BVStatic<4096UL>::SetRange(BVStatic<4096UL> *this,BVIndex index,uint length)

{
  BVUnit *pBVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  
  AssertRange(this,index);
  AssertRange(this,(index + length) - 1);
  pBVar1 = BitsFromIndex(this,index);
  sVar2 = (sbyte)(index & 0x3f);
  if ((index & 0x3f) + length < 0x41) {
    uVar4 = (0xffffffffffffffffU >> (-(char)length & 0x3fU)) << sVar2;
  }
  else {
    pBVar1->word = pBVar1->word | -1L << sVar2;
    for (uVar3 = (index | 0xffffffc0) + length; pBVar1 = pBVar1 + 1, 0x3f < uVar3;
        uVar3 = uVar3 - 0x40) {
      pBVar1->word = 0xffffffffffffffff;
    }
    if (uVar3 == 0) {
      return;
    }
    uVar4 = 0xffffffffffffffff >> (-(char)uVar3 & 0x3fU);
  }
  pBVar1->word = pBVar1->word | uVar4;
  return;
}

Assistant:

void SetRange(const BVIndex index, uint length)
    {
        AssertRange(index);
        AssertRange(index + length - 1);

        BVUnit * bvUnit = BitsFromIndex(index);
        uint offset = BVUnit::Offset(index);

        if (offset + length <= BVUnit::BitsPerWord)
        {
            // Bit range is in a single word
            return bvUnit->SetRange(offset, length);
        }

        // Bit range spans words.
        // Set the first word, from start offset to end of word
        bvUnit->SetRange(offset, (BVUnit::BitsPerWord - offset));

        bvUnit++;
        length -= (BVUnit::BitsPerWord - offset);

        // Set entire words until we are at the last word
        while (length >= BVUnit::BitsPerWord)
        {
            bvUnit->SetAll();

            bvUnit++;
            length -= BVUnit::BitsPerWord;
        }

        // Set last word (unless we already ended on a word boundary)
        if (length > 0)
        {
            bvUnit->SetRange(0, length);
        }
    }